

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmCpGen<(moira::Instr)149,(moira::Mode)12,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  uint in_EAX;
  Imu<4> im;
  StrWriter *this_00;
  undefined8 uStack_28;
  
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    dasmIllegal<(moira::Instr)149,(moira::Mode)12,0>(this,str,addr,op);
    return;
  }
  uStack_28._0_4_ = in_EAX;
  im.raw = dasmIncRead<4>(this,addr);
  StrWriter::operator<<(str,op >> 9 & 7);
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  StrWriter::operator<<(this_00,im);
  uStack_28 = (ulong)(uint)uStack_28;
  StrWriter::operator<<(str,(Av<(moira::Instr)149,_(moira::Mode)12,_0> *)((long)&uStack_28 + 4));
  return;
}

Assistant:

void
Moira::dasmCpGen(StrWriter &str, u32 &addr, u16 op) const
{
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    auto id  = ( ____xxx_________(op) );
    auto ext = Imu ( dasmIncRead<Long>(addr) );

    str << id << Ins<I>{} << str.tab << ext;
    str << Av<I, M, S>{};
}